

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_dx_iface.c
# Opt level: O2

aom_codec_err_t ctrl_get_tile_data(aom_codec_alg_priv_t *ctx,__va_list_tag *args)

{
  uint uVar1;
  undefined8 *puVar2;
  aom_codec_err_t aVar3;
  long *plVar4;
  long lVar5;
  long lVar6;
  
  uVar1 = args->gp_offset;
  if ((ulong)uVar1 < 0x29) {
    plVar4 = (long *)((ulong)uVar1 + (long)args->reg_save_area);
    args->gp_offset = uVar1 + 8;
  }
  else {
    plVar4 = (long *)args->overflow_arg_area;
    args->overflow_arg_area = plVar4 + 1;
  }
  puVar2 = (undefined8 *)*plVar4;
  if (puVar2 == (undefined8 *)0x0) {
    aVar3 = AOM_CODEC_INVALID_PARAM;
  }
  else {
    if (ctx->frame_worker != (AVxWorker *)0x0) {
      lVar5 = *ctx->frame_worker->data1;
      lVar6 = (long)*(int *)(lVar5 + 0x58da0) * 0x400 + lVar5;
      lVar5 = (long)*(int *)(lVar5 + 0x58da4) * 0x10;
      *puVar2 = *(undefined8 *)(lVar5 + 0x48d38 + lVar6);
      puVar2[1] = *(undefined8 *)(lVar5 + 0x48d30 + lVar6);
      return AOM_CODEC_OK;
    }
    aVar3 = AOM_CODEC_ERROR;
  }
  return aVar3;
}

Assistant:

static aom_codec_err_t ctrl_get_tile_data(aom_codec_alg_priv_t *ctx,
                                          va_list args) {
  aom_tile_data *const tile_data = va_arg(args, aom_tile_data *);

  if (tile_data) {
    if (ctx->frame_worker) {
      AVxWorker *const worker = ctx->frame_worker;
      FrameWorkerData *const frame_worker_data =
          (FrameWorkerData *)worker->data1;
      const AV1Decoder *pbi = frame_worker_data->pbi;
      tile_data->coded_tile_data_size =
          pbi->tile_buffers[pbi->dec_tile_row][pbi->dec_tile_col].size;
      tile_data->coded_tile_data =
          pbi->tile_buffers[pbi->dec_tile_row][pbi->dec_tile_col].data;
      return AOM_CODEC_OK;
    } else {
      return AOM_CODEC_ERROR;
    }
  }

  return AOM_CODEC_INVALID_PARAM;
}